

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  long in_FS_OFFSET;
  
  StatsAccumulator::ReportCounter(accum,"Scene/Textures",*(int64_t *)(in_FS_OFFSET + -0x20));
  *(undefined8 *)(in_FS_OFFSET + -0x20) = 0;
  return;
}

Assistant:

FloatTextureHandle FloatTextureHandle::Create(
    const std::string &name, const Transform &renderFromTexture,
    const TextureParameterDictionary &parameters, const FileLoc *loc, Allocator alloc,
    bool gpu) {
    FloatTextureHandle tex;
    if (name == "constant")
        tex = FloatConstantTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "scale")
        tex = FloatScaledTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "mix")
        tex = FloatMixTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "bilerp")
        tex = FloatBilerpTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "imagemap") {
        if (gpu)
            tex = GPUFloatImageTexture::Create(renderFromTexture, parameters, loc, alloc);
        else
            tex = FloatImageTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else if (name == "checkerboard")
        tex = FloatCheckerboardTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "dots")
        tex = FloatDotsTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "fbm")
        tex = FBmTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "wrinkled")
        tex = WrinkledTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "windy")
        tex = WindyTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "ptex") {
        if (gpu)
            ErrorExit(loc, "ptex texture is not supported on the GPU.");
        else
            tex = FloatPtexTexture::Create(renderFromTexture, parameters, loc, alloc);
    } else
        ErrorExit(loc, "%s: float texture type unknown.", name);

    if (!tex)
        ErrorExit(loc, "%s: unable to create texture.", name);

    ++nTextures;

    // FIXME: reenable this once we handle all the same image texture parameters
    // CO    parameters.ReportUnused();
    return tex;
}